

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_dss_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  uchar *puVar8;
  int ret;
  unsigned_long len;
  unsigned_long y_len;
  unsigned_long g_len;
  unsigned_long q_len;
  unsigned_long p_len;
  uchar *s;
  uchar *y;
  uchar *g;
  uchar *q;
  uchar *p;
  DSA *dsactx;
  void **abstract_local;
  size_t hostkey_data_len_local;
  uchar *hostkey_data_local;
  LIBSSH2_SESSION *session_local;
  
  dsactx = (DSA *)abstract;
  abstract_local = (void **)hostkey_data_len;
  hostkey_data_len_local = (size_t)hostkey_data;
  hostkey_data_local = (uchar *)session;
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_dss_dtor(session,abstract);
    *(undefined8 *)dsactx = 0;
  }
  sVar1 = hostkey_data_len_local;
  uVar2 = _libssh2_ntohu32((uchar *)hostkey_data_len_local);
  if ((uVar2 == 7) && (iVar3 = strncmp((char *)(sVar1 + 4),"ssh-dss",7), iVar3 == 0)) {
    uVar2 = _libssh2_ntohu32((uchar *)(sVar1 + 0xb));
    puVar7 = (uchar *)(sVar1 + 0xf) + uVar2;
    uVar4 = _libssh2_ntohu32(puVar7);
    puVar7 = puVar7 + 4;
    puVar8 = puVar7 + uVar4;
    uVar5 = _libssh2_ntohu32(puVar8);
    puVar8 = puVar8 + 4;
    uVar6 = _libssh2_ntohu32(puVar8 + uVar5);
    iVar3 = _libssh2_dsa_new((DSA **)&p,(uchar *)(sVar1 + 0xf),(ulong)uVar2,puVar7,(ulong)uVar4,
                             puVar8,(ulong)uVar5,puVar8 + uVar5 + 4,(ulong)uVar6,(uchar *)0x0,0);
    if (iVar3 != 0) {
      return -1;
    }
    *(uchar **)dsactx = p;
    return 0;
  }
  return -1;
}

Assistant:

static int
hostkey_method_ssh_dss_init(LIBSSH2_SESSION * session,
                            const unsigned char *hostkey_data,
                            size_t hostkey_data_len,
                            void **abstract)
{
    libssh2_dsa_ctx *dsactx;
    const unsigned char *p, *q, *g, *y, *s;
    unsigned long p_len, q_len, g_len, y_len, len;
    int ret;

    (void) hostkey_data_len;

    if (*abstract) {
        hostkey_method_ssh_dss_dtor(session, abstract);
        *abstract = NULL;
    }

    s = hostkey_data;
    len = _libssh2_ntohu32(s);
    s += 4;
    if (len != 7 || strncmp((char *) s, "ssh-dss", 7) != 0) {
        return -1;
    }
    s += 7;

    p_len = _libssh2_ntohu32(s);
    s += 4;
    p = s;
    s += p_len;
    q_len = _libssh2_ntohu32(s);
    s += 4;
    q = s;
    s += q_len;
    g_len = _libssh2_ntohu32(s);
    s += 4;
    g = s;
    s += g_len;
    y_len = _libssh2_ntohu32(s);
    s += 4;
    y = s;
    /* s += y_len; */

    ret = _libssh2_dsa_new(&dsactx, p, p_len, q, q_len,
                           g, g_len, y, y_len, NULL, 0);
    if (ret) {
        return -1;
    }

    *abstract = dsactx;

    return 0;
}